

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_colorspace(j_compress_ptr cinfo,J_COLOR_SPACE colorspace)

{
  jpeg_component_info *pjVar1;
  int local_24;
  int ci;
  jpeg_component_info *compptr;
  J_COLOR_SPACE colorspace_local;
  j_compress_ptr cinfo_local;
  
  if (cinfo->global_state != 100) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->jpeg_color_space = colorspace;
  cinfo->write_JFIF_header = 0;
  cinfo->write_Adobe_marker = 0;
  switch(colorspace) {
  case JCS_UNKNOWN:
    cinfo->num_components = cinfo->input_components;
    if ((cinfo->num_components < 1) || (10 < cinfo->num_components)) {
      cinfo->err->msg_code = 0x1b;
      (cinfo->err->msg_parm).i[0] = cinfo->num_components;
      (cinfo->err->msg_parm).i[1] = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    for (local_24 = 0; local_24 < cinfo->num_components; local_24 = local_24 + 1) {
      pjVar1 = cinfo->comp_info + local_24;
      pjVar1->component_id = local_24;
      pjVar1->h_samp_factor = 1;
      pjVar1->v_samp_factor = 1;
      pjVar1->quant_tbl_no = 0;
      pjVar1->dc_tbl_no = 0;
      pjVar1->ac_tbl_no = 0;
    }
    break;
  case JCS_GRAYSCALE:
    cinfo->write_JFIF_header = 1;
    cinfo->num_components = 1;
    pjVar1 = cinfo->comp_info;
    pjVar1->component_id = 1;
    pjVar1->h_samp_factor = 1;
    pjVar1->v_samp_factor = 1;
    pjVar1->quant_tbl_no = 0;
    pjVar1->dc_tbl_no = 0;
    pjVar1->ac_tbl_no = 0;
    break;
  case JCS_RGB:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 3;
    pjVar1 = cinfo->comp_info;
    pjVar1->component_id = 0x52;
    pjVar1->h_samp_factor = 1;
    pjVar1->v_samp_factor = 1;
    pjVar1->quant_tbl_no = 0;
    pjVar1->dc_tbl_no = 0;
    pjVar1->ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[1].component_id = 0x47;
    pjVar1[1].h_samp_factor = 1;
    pjVar1[1].v_samp_factor = 1;
    pjVar1[1].quant_tbl_no = 0;
    pjVar1[1].dc_tbl_no = 0;
    pjVar1[1].ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[2].component_id = 0x42;
    pjVar1[2].h_samp_factor = 1;
    pjVar1[2].v_samp_factor = 1;
    pjVar1[2].quant_tbl_no = 0;
    pjVar1[2].dc_tbl_no = 0;
    pjVar1[2].ac_tbl_no = 0;
    break;
  case JCS_YCbCr:
    cinfo->write_JFIF_header = 1;
    cinfo->num_components = 3;
    pjVar1 = cinfo->comp_info;
    pjVar1->component_id = 1;
    pjVar1->h_samp_factor = 2;
    pjVar1->v_samp_factor = 2;
    pjVar1->quant_tbl_no = 0;
    pjVar1->dc_tbl_no = 0;
    pjVar1->ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[1].component_id = 2;
    pjVar1[1].h_samp_factor = 1;
    pjVar1[1].v_samp_factor = 1;
    pjVar1[1].quant_tbl_no = 1;
    pjVar1[1].dc_tbl_no = 1;
    pjVar1[1].ac_tbl_no = 1;
    pjVar1 = cinfo->comp_info;
    pjVar1[2].component_id = 3;
    pjVar1[2].h_samp_factor = 1;
    pjVar1[2].v_samp_factor = 1;
    pjVar1[2].quant_tbl_no = 1;
    pjVar1[2].dc_tbl_no = 1;
    pjVar1[2].ac_tbl_no = 1;
    break;
  case JCS_CMYK:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 4;
    pjVar1 = cinfo->comp_info;
    pjVar1->component_id = 0x43;
    pjVar1->h_samp_factor = 1;
    pjVar1->v_samp_factor = 1;
    pjVar1->quant_tbl_no = 0;
    pjVar1->dc_tbl_no = 0;
    pjVar1->ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[1].component_id = 0x4d;
    pjVar1[1].h_samp_factor = 1;
    pjVar1[1].v_samp_factor = 1;
    pjVar1[1].quant_tbl_no = 0;
    pjVar1[1].dc_tbl_no = 0;
    pjVar1[1].ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[2].component_id = 0x59;
    pjVar1[2].h_samp_factor = 1;
    pjVar1[2].v_samp_factor = 1;
    pjVar1[2].quant_tbl_no = 0;
    pjVar1[2].dc_tbl_no = 0;
    pjVar1[2].ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[3].component_id = 0x4b;
    pjVar1[3].h_samp_factor = 1;
    pjVar1[3].v_samp_factor = 1;
    pjVar1[3].quant_tbl_no = 0;
    pjVar1[3].dc_tbl_no = 0;
    pjVar1[3].ac_tbl_no = 0;
    break;
  case JCS_YCCK:
    cinfo->write_Adobe_marker = 1;
    cinfo->num_components = 4;
    pjVar1 = cinfo->comp_info;
    pjVar1->component_id = 1;
    pjVar1->h_samp_factor = 2;
    pjVar1->v_samp_factor = 2;
    pjVar1->quant_tbl_no = 0;
    pjVar1->dc_tbl_no = 0;
    pjVar1->ac_tbl_no = 0;
    pjVar1 = cinfo->comp_info;
    pjVar1[1].component_id = 2;
    pjVar1[1].h_samp_factor = 1;
    pjVar1[1].v_samp_factor = 1;
    pjVar1[1].quant_tbl_no = 1;
    pjVar1[1].dc_tbl_no = 1;
    pjVar1[1].ac_tbl_no = 1;
    pjVar1 = cinfo->comp_info;
    pjVar1[2].component_id = 3;
    pjVar1[2].h_samp_factor = 1;
    pjVar1[2].v_samp_factor = 1;
    pjVar1[2].quant_tbl_no = 1;
    pjVar1[2].dc_tbl_no = 1;
    pjVar1[2].ac_tbl_no = 1;
    pjVar1 = cinfo->comp_info;
    pjVar1[3].component_id = 4;
    pjVar1[3].h_samp_factor = 2;
    pjVar1[3].v_samp_factor = 2;
    pjVar1[3].quant_tbl_no = 0;
    pjVar1[3].dc_tbl_no = 0;
    pjVar1[3].ac_tbl_no = 0;
    break;
  default:
    cinfo->err->msg_code = 0xb;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_colorspace (j_compress_ptr cinfo, J_COLOR_SPACE colorspace)
{
  jpeg_component_info * compptr;
  int ci;

#define SET_COMP(index,id,hsamp,vsamp,quant,dctbl,actbl)  \
  (compptr = &cinfo->comp_info[index], \
   compptr->component_id = (id), \
   compptr->h_samp_factor = (hsamp), \
   compptr->v_samp_factor = (vsamp), \
   compptr->quant_tbl_no = (quant), \
   compptr->dc_tbl_no = (dctbl), \
   compptr->ac_tbl_no = (actbl) )

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* For all colorspaces, we use Q and Huff tables 0 for luminance components,
   * tables 1 for chrominance components.
   */

  cinfo->jpeg_color_space = colorspace;

  cinfo->write_JFIF_header = FALSE; /* No marker for non-JFIF colorspaces */
  cinfo->write_Adobe_marker = FALSE; /* write no Adobe marker by default */

  switch (colorspace) {
  case JCS_GRAYSCALE:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 1;
    /* JFIF specifies component ID 1 */
    SET_COMP(0, 1, 1,1, 0, 0,0);
    break;
  case JCS_RGB:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag RGB */
    cinfo->num_components = 3;
    SET_COMP(0, 0x52 /* 'R' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x47 /* 'G' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x42 /* 'B' */, 1,1, 0, 0,0);
    break;
  case JCS_YCbCr:
    cinfo->write_JFIF_header = TRUE; /* Write a JFIF marker */
    cinfo->num_components = 3;
    /* JFIF specifies component IDs 1,2,3 */
    /* We default to 2x2 subsamples of chrominance */
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    break;
  case JCS_CMYK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag CMYK */
    cinfo->num_components = 4;
    SET_COMP(0, 0x43 /* 'C' */, 1,1, 0, 0,0);
    SET_COMP(1, 0x4D /* 'M' */, 1,1, 0, 0,0);
    SET_COMP(2, 0x59 /* 'Y' */, 1,1, 0, 0,0);
    SET_COMP(3, 0x4B /* 'K' */, 1,1, 0, 0,0);
    break;
  case JCS_YCCK:
    cinfo->write_Adobe_marker = TRUE; /* write Adobe marker to flag YCCK */
    cinfo->num_components = 4;
    SET_COMP(0, 1, 2,2, 0, 0,0);
    SET_COMP(1, 2, 1,1, 1, 1,1);
    SET_COMP(2, 3, 1,1, 1, 1,1);
    SET_COMP(3, 4, 2,2, 0, 0,0);
    break;
  case JCS_UNKNOWN:
    cinfo->num_components = cinfo->input_components;
    if (cinfo->num_components < 1 || cinfo->num_components > MAX_COMPONENTS)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPONENTS);
    for (ci = 0; ci < cinfo->num_components; ci++) {
      SET_COMP(ci, ci, 1,1, 0, 0,0);
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
  }
}